

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::
     TupleMatches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>>,std::tuple<unsigned_short,unsigned_short>>
               (tuple<testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_>
                *matcher_tuple,tuple<unsigned_short,_unsigned_short> *value_tuple)

{
  bool bVar1;
  tuple<unsigned_short,_unsigned_short> *value_tuple_local;
  tuple<testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_> *matcher_tuple_local;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>>,std::tuple<unsigned_short,unsigned_short>>
                    (matcher_tuple,value_tuple);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(tuple_size<MatcherTuple>::value ==
                        tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<tuple_size<ValueTuple>::value>::
      Matches(matcher_tuple, value_tuple);
}